

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTagType
          (BinaryReaderInterp *this,Index index,Index sig_index)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Enum EVar3;
  Location loc_1;
  TagType tag_type;
  undefined1 local_c8 [16];
  anon_union_16_2_ecfd7102_for_Location_1 local_b8;
  pointer local_a8;
  undefined1 local_98 [8];
  char *pcStack_90;
  anon_union_16_2_ecfd7102_for_Location_1 local_88;
  pointer local_78;
  Var local_70;
  
  local_88.field_0.last_column = 0;
  local_98 = (undefined1  [8])(this->filename_)._M_len;
  pcStack_90 = (this->filename_)._M_str;
  local_b8.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_b8.field_0.last_column = 0;
  local_c8._0_8_ = (this->filename_)._M_len;
  local_c8._8_8_ = (this->filename_)._M_str;
  local_88.field_1.offset = local_b8.field_1.offset;
  Var::Var(&local_70,sig_index,(Location *)local_c8);
  RVar2 = SharedValidator::OnTag(&this->validator_,(Location *)local_98,&local_70);
  Var::~Var(&local_70);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    pcStack_90 = (char *)0x4;
    local_98 = (undefined1  [8])&PTR__TagType_00244310;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_88.field_0,
               &(this->module_->func_types).
                super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
                _M_impl.super__Vector_impl_data._M_start[sig_index].params);
    pMVar1 = this->module_;
    local_c8._0_8_ = &PTR__TagType_00244310;
    local_c8._8_8_ = pcStack_90;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_b8.field_0,
               (vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_88.field_0);
    std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>::
    emplace_back<wabt::interp::TagDesc>(&pMVar1->tags,(TagDesc *)local_c8);
    local_c8._0_8_ = &PTR__TagType_00244310;
    if (local_b8.field_1.offset != 0) {
      operator_delete((void *)local_b8.field_1.offset,(long)local_a8 - local_b8._0_8_);
    }
    std::vector<wabt::interp::TagType,_std::allocator<wabt::interp::TagType>_>::push_back
              (&this->tag_types_,(value_type *)local_98);
    local_98 = (undefined1  [8])&PTR__TagType_00244310;
    if (local_88.field_1.offset != 0) {
      operator_delete((void *)local_88.field_1.offset,(long)local_78 - local_88._0_8_);
    }
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnTagType(Index index, Index sig_index) {
  CHECK_RESULT(validator_.OnTag(GetLocation(), Var(sig_index, GetLocation())));
  FuncType& func_type = module_.func_types[sig_index];
  TagType tag_type{TagAttr::Exception, func_type.params};
  module_.tags.push_back(TagDesc{tag_type});
  tag_types_.push_back(tag_type);
  return Result::Ok;
}